

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmFBcc<(moira::Instr)188,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *pSVar3;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<4>(this,addr);
  if (uVar2 == 0 && (op & 0x7f) == 0) {
    dasmFNop<(moira::Instr)196,(moira::Mode)12,4>(this,str,addr,op);
    return;
  }
  pSVar3 = StrWriter::operator<<(str);
  StrWriter::operator<<(pSVar3,(Fcc)(op & 0x1f));
  pSVar3 = StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar3,(UInt)(uVar1 + uVar2 + 2));
  return;
}

Assistant:

void
Moira::dasmFBcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<S>(addr);
    auto cnd = ___________xxxxx (op);

    // Check for special FNOP opcode
    if ((op & 0x7F) == 0 && ext == 0) {

        dasmFNop<Instr::FNOP, M, S>(str, addr, op);
        return;
    }

    auto dst = old + 2;
    U32_INC(dst, SEXT<S>(ext));

    if (S == Long) {
        str << Ins<I>{} << Fcc{cnd} << Sz<S>{} << str.tab << UInt(dst);
    } else {
        str << Ins<I>{} << Fcc{cnd} << str.tab << UInt(dst);
    }
}